

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O2

void spvtools::opt::analysis::anon_unknown_0::SetInlinedOperand
               (Instruction *dbg_inlined_at,uint32_t inlined_operand)

{
  CommonDebugInfoInstructions CVar1;
  Operand *this;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  uint32_t local_7c;
  Operand local_78;
  SmallVector<unsigned_int,_2UL> local_48;
  
  CVar1 = Instruction::GetCommonDebugOpcode(dbg_inlined_at);
  if (CVar1 == CommonDebugInfoDebugInlinedAt) {
    if ((uint)(((long)(dbg_inlined_at->operands_).
                      super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(dbg_inlined_at->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x30) < 7) {
      this = (Operand *)&local_48;
      init_list._M_len = 1;
      init_list._M_array = &local_7c;
      local_7c = inlined_operand;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)this,init_list);
      local_78.type = SPV_OPERAND_TYPE_ID;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                (&local_78.words,(SmallVector<unsigned_int,_2UL> *)this);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&dbg_inlined_at->operands_,&local_78);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_78.words);
    }
    else {
      this = &local_78;
      init_list_00._M_len = 1;
      init_list_00._M_array = (iterator)&local_48;
      local_48._vptr_SmallVector._0_4_ = inlined_operand;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector
                ((SmallVector<unsigned_int,_2UL> *)this,init_list_00);
      Instruction::SetOperand(dbg_inlined_at,6,(OperandData *)this);
    }
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector((SmallVector<unsigned_int,_2UL> *)this);
    return;
  }
  __assert_fail("dbg_inlined_at->GetCommonDebugOpcode() == CommonDebugInfoDebugInlinedAt",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                ,0x36,
                "void spvtools::opt::analysis::(anonymous namespace)::SetInlinedOperand(Instruction *, uint32_t)"
               );
}

Assistant:

void SetInlinedOperand(Instruction* dbg_inlined_at, uint32_t inlined_operand) {
  assert(dbg_inlined_at);
  assert(dbg_inlined_at->GetCommonDebugOpcode() ==
         CommonDebugInfoDebugInlinedAt);
  if (dbg_inlined_at->NumOperands() <= kDebugInlinedAtOperandInlinedIndex) {
    dbg_inlined_at->AddOperand(
        {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {inlined_operand}});
  } else {
    dbg_inlined_at->SetOperand(kDebugInlinedAtOperandInlinedIndex,
                               {inlined_operand});
  }
}